

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superscalar.cpp
# Opt level: O3

bool __thiscall
randomx::SuperscalarInstruction::selectSource
          (SuperscalarInstruction *this,int cycle,RegisterInfo (*registers) [8],Blake2Generator *gen
          )

{
  bool bVar1;
  int iVar2;
  uint i;
  long lVar3;
  vector<int,_std::allocator<int>_> availableRegisters;
  int local_5c;
  vector<int,_std::allocator<int>_> local_58;
  Blake2Generator *local_38;
  
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  lVar3 = 0;
  local_38 = gen;
  do {
    if (((RegisterInfo *)&(*registers)[0].latency)->latency <= cycle) {
      local_5c = (int)lVar3;
      if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_58,
                   (iterator)
                   local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_5c);
      }
      else {
        *local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_5c;
        local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
    }
    lVar3 = lVar3 + 1;
    registers = (RegisterInfo (*) [8])((long)registers + 0x10);
  } while (lVar3 != 8);
  if ((((long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish -
        (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start == 8) && (this->info_->type_ == IADD_RS)) &&
     ((*local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start == 5 ||
      (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start[1] == 5)))) {
    this->src_ = 5;
    iVar2 = 5;
  }
  else {
    bVar1 = selectRegister(&local_58,local_38,&this->src_);
    if (!bVar1) {
      bVar1 = false;
      goto LAB_001150b2;
    }
    bVar1 = true;
    if (this->groupParIsSource_ != true) goto LAB_001150b2;
    iVar2 = this->src_;
  }
  this->opGroupPar_ = iVar2;
  bVar1 = true;
LAB_001150b2:
  if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    ::operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool selectSource(int cycle, RegisterInfo(&registers)[8], Blake2Generator& gen) {
			std::vector<int> availableRegisters;
			//all registers that are ready at the cycle
			for (unsigned i = 0; i < 8; ++i) {
				if (registers[i].latency <= cycle)
					availableRegisters.push_back(i);
			}
			//if there are only 2 available registers for IADD_RS and one of them is r5, select it as the source because it cannot be the destination
			if (availableRegisters.size() == 2 && info_->getType() == SuperscalarInstructionType::IADD_RS) {
				if (availableRegisters[0] == RegisterNeedsDisplacement || availableRegisters[1] == RegisterNeedsDisplacement) {
					opGroupPar_ = src_ = RegisterNeedsDisplacement;
					return true;
				}
			}
			if (selectRegister(availableRegisters, gen, src_)) {
				if (groupParIsSource_)
					opGroupPar_ = src_;
				return true;
			}
			return false;
		}